

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_cdef(AV1_COMMON *cm,aom_reader *r,MACROBLOCKD *xd)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *in_RDX;
  long in_RDI;
  MB_MODE_INFO *mbmi;
  int grid_idx;
  CommonModeInfoParams *mi_params;
  int first_block_mask;
  int index;
  int cdef_unit_col_in_sb;
  int cdef_unit_row_in_sb;
  int index_mask;
  int cdef_size;
  int mi_col_in_sb;
  int mi_row_in_sb;
  int sb_mask;
  int skip_txfm;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  
  cVar1 = *(char *)(**(long **)(in_RDX + 0x7ae) + 0x90);
  if (((*(byte *)(in_RDI + 499) & 1) == 0) && ((*(byte *)(in_RDI + 0x1f0) & 1) == 0)) {
    uVar3 = *(int *)(*(long *)(in_RDI + 0x6088) + 0x20) - 1;
    if (((*in_RDX & uVar3) == 0) && ((in_RDX[1] & uVar3) == 0)) {
      *(undefined1 *)(in_RDX + 0xa82) = 0;
      *(undefined1 *)((long)in_RDX + 0x2a07) = 0;
      *(undefined1 *)((long)in_RDX + 0x2a06) = 0;
      *(undefined1 *)((long)in_RDX + 0x2a05) = 0;
    }
    if (*(char *)(*(long *)(in_RDI + 0x6088) + 0x1c) == '\x0f') {
      iVar4 = (uint)((in_RDX[1] & 0x10) != 0) + (uint)((*in_RDX & 0x10) != 0) * 2;
    }
    else {
      iVar4 = 0;
    }
    if (((*(byte *)((long)in_RDX + (long)iVar4 + 0x2a05) & 1) == 0) && (cVar1 == '\0')) {
      iVar6 = iVar4;
      iVar5 = get_mi_grid_idx((CommonModeInfoParams *)(in_RDI + 0x208),*in_RDX & 0xfffffff0,
                              in_RDX[1] & 0xfffffff0);
      lVar2 = *(long *)(*(long *)(in_RDI + 0x238) + (long)iVar5 * 8);
      iVar6 = aom_read_literal_((aom_reader *)CONCAT44(iVar6,in_stack_ffffffffffffffa0),
                                in_stack_ffffffffffffff9c);
      *(ushort *)(lVar2 + 0xa7) = *(ushort *)(lVar2 + 0xa7) & 0x87ff | ((byte)iVar6 & 0xf) << 0xb;
      *(undefined1 *)((long)in_RDX + (long)iVar4 + 0x2a05) = 1;
    }
  }
  return;
}

Assistant:

static void read_cdef(AV1_COMMON *cm, aom_reader *r, MACROBLOCKD *const xd) {
  const int skip_txfm = xd->mi[0]->skip_txfm;
  if (cm->features.coded_lossless) return;
  if (cm->features.allow_intrabc) {
    assert(cm->cdef_info.cdef_bits == 0);
    return;
  }

  // At the start of a superblock, mark that we haven't yet read CDEF strengths
  // for any of the CDEF units contained in this superblock.
  const int sb_mask = (cm->seq_params->mib_size - 1);
  const int mi_row_in_sb = (xd->mi_row & sb_mask);
  const int mi_col_in_sb = (xd->mi_col & sb_mask);
  if (mi_row_in_sb == 0 && mi_col_in_sb == 0) {
    xd->cdef_transmitted[0] = xd->cdef_transmitted[1] =
        xd->cdef_transmitted[2] = xd->cdef_transmitted[3] = false;
  }

  // CDEF unit size is 64x64 irrespective of the superblock size.
  const int cdef_size = 1 << (6 - MI_SIZE_LOG2);

  // Find index of this CDEF unit in this superblock.
  const int index_mask = cdef_size;
  const int cdef_unit_row_in_sb = ((xd->mi_row & index_mask) != 0);
  const int cdef_unit_col_in_sb = ((xd->mi_col & index_mask) != 0);
  const int index = (cm->seq_params->sb_size == BLOCK_128X128)
                        ? cdef_unit_col_in_sb + 2 * cdef_unit_row_in_sb
                        : 0;

  // Read CDEF strength from the first non-skip coding block in this CDEF unit.
  if (!xd->cdef_transmitted[index] && !skip_txfm) {
    // CDEF strength for this CDEF unit needs to be read into the MB_MODE_INFO
    // of the 1st block in this CDEF unit.
    const int first_block_mask = ~(cdef_size - 1);
    CommonModeInfoParams *const mi_params = &cm->mi_params;
    const int grid_idx =
        get_mi_grid_idx(mi_params, xd->mi_row & first_block_mask,
                        xd->mi_col & first_block_mask);
    MB_MODE_INFO *const mbmi = mi_params->mi_grid_base[grid_idx];
    mbmi->cdef_strength =
        aom_read_literal(r, cm->cdef_info.cdef_bits, ACCT_STR);
    xd->cdef_transmitted[index] = true;
  }
}